

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

void __thiscall front::syntax::SyntaxAnalyze::gm_while_stmt_flat(SyntaxAnalyze *this)

{
  WhileLabels wl;
  size_t sVar1;
  element_type *peVar2;
  SyntaxAnalyze *in_RDI;
  RightVal right_1;
  string tmpName_1;
  RightVal right;
  string tmpName;
  uint32_t endWhileIndex;
  uint32_t condIndex;
  WhileLabels whileLabels;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> condStr
  ;
  LabelId whileBegin;
  LabelId whileEnd;
  LabelId whileTrue;
  SharedExNdPtr cond;
  irGenerator *in_stack_fffffffffffffd78;
  LabelId in_stack_fffffffffffffd80;
  LabelId in_stack_fffffffffffffd84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__u;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd90;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  LabelId in_stack_fffffffffffffdec;
  irGenerator *in_stack_fffffffffffffdf0;
  SyntaxAnalyze *in_stack_fffffffffffffe40;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  string local_178 [56];
  RightVal *in_stack_fffffffffffffec0;
  LeftVal *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  JumpKind in_stack_fffffffffffffed4;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffed8;
  LabelId in_stack_fffffffffffffee4;
  LabelId in_stack_fffffffffffffee8;
  JumpInstructionKind in_stack_fffffffffffffeec;
  SyntaxAnalyze *in_stack_fffffffffffffef0;
  TyKind in_stack_ffffffffffffff04;
  irGenerator *in_stack_ffffffffffffff08;
  string local_a8 [48];
  WhileLabels local_78;
  uint local_70;
  uint local_6c;
  WhileLabels local_68 [6];
  LabelId local_34;
  LabelId local_30;
  LabelId local_1c;
  
  std::shared_ptr<front::express::ExpressNode>::shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2ae0f9);
  local_1c = irGenerator::irGenerator::getNewLabelId(&in_RDI->irGenerator);
  local_30 = irGenerator::irGenerator::getNewLabelId(&in_RDI->irGenerator);
  local_34 = irGenerator::irGenerator::getNewLabelId(&in_RDI->irGenerator);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x2ae163);
  irGenerator::WhileLabels::WhileLabels(local_68,local_34,local_30);
  local_78 = local_68[0];
  wl._endLabel = in_stack_fffffffffffffd84;
  wl._beginLabel = in_stack_fffffffffffffd80;
  irGenerator::irGenerator::pushWhile(in_stack_fffffffffffffd78,wl);
  match_one_word(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  match_one_word(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  sVar1 = get_matched_index(in_RDI);
  local_6c = (uint)sVar1;
  gm_cond((SyntaxAnalyze *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  std::shared_ptr<front::express::ExpressNode>::operator=
            ((shared_ptr<front::express::ExpressNode> *)
             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
             (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd78);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2ae21d);
  peVar2 = std::
           __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ae22a);
  if (peVar2->_type == CNS) {
    irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x2ae25f);
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ae26c);
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               (int *)in_stack_fffffffffffffd78);
    std::variant<int,std::__cxx11::string>::
    variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
              ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd78);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
              (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffd78);
    irGenerator::irGenerator::ir_assign
              ((irGenerator *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x2ae2e4);
    std::
    variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2ae2f1);
    std::optional<std::__cxx11::string>::operator=
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x2ae315);
    std::__cxx11::string::~string(local_a8);
  }
  else {
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ae3df);
    std::optional<std::__cxx11::string>::operator=
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)in_stack_fffffffffffffd78);
  irGenerator::irGenerator::ir_jump
            ((irGenerator *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
             in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffed8,
             in_stack_fffffffffffffed4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2ae464);
  irGenerator::irGenerator::ir_label(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
  match_one_word(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  gm_stmt(in_stack_fffffffffffffe40);
  irGenerator::irGenerator::ir_label(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
  sVar1 = get_matched_index(in_RDI);
  local_70 = (uint)sVar1;
  set_matched_index(in_RDI,(ulong)local_6c);
  gm_cond((SyntaxAnalyze *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  std::shared_ptr<front::express::ExpressNode>::operator=
            ((shared_ptr<front::express::ExpressNode> *)
             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
             (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd78);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2ae519);
  set_matched_index(in_RDI,(ulong)local_70);
  peVar2 = std::
           __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ae53b);
  if (peVar2->_type == CNS) {
    irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
    this_00 = &local_1a0;
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x2ae570);
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ae57d);
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               (int *)in_stack_fffffffffffffd78);
    __u = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_RDI->irGenerator;
    std::variant<int,std::__cxx11::string>::
    variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
              ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd78);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
              (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffd78);
    irGenerator::irGenerator::ir_assign
              ((irGenerator *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x2ae5f5);
    std::
    variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2ae602);
    std::optional<std::__cxx11::string>::operator=(this_00,__u);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x2ae626);
    std::__cxx11::string::~string(local_178);
  }
  else {
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ae6e4);
    std::optional<std::__cxx11::string>::operator=
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)CONCAT44(local_30,local_1c),
           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&in_RDI->irGenerator);
  irGenerator::irGenerator::ir_jump
            ((irGenerator *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
             in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffed8,
             in_stack_fffffffffffffed4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2ae75e);
  irGenerator::irGenerator::ir_label(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
  irGenerator::irGenerator::popWhile((irGenerator *)0x2ae783);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2ae792);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2ae79f);
  return;
}

Assistant:

void SyntaxAnalyze::gm_while_stmt_flat() {
  SharedExNdPtr cond;
  LabelId whileTrue = irGenerator.getNewLabelId();
  LabelId whileEnd = irGenerator.getNewLabelId();
  LabelId whileBegin = irGenerator.getNewLabelId();
  std::optional<string> condStr;
  irGenerator::WhileLabels whileLabels =
      irGenerator::WhileLabels(whileBegin, whileEnd);
  uint32_t condIndex;
  uint32_t endWhileIndex;

  irGenerator.pushWhile(whileLabels);

  match_one_word(Token::WHILETK);
  match_one_word(Token::LPARENT);

  condIndex = get_matched_index();
  cond = gm_cond();

  if (cond->_type == NodeType::CNS) {
    string tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
    RightVal right;
    right.emplace<0>(cond->_value);
    irGenerator.ir_assign(tmpName, right);
    condStr = tmpName;
  } else {
    condStr = cond->_name;
  }
  irGenerator.ir_jump(mir::inst::JumpInstructionKind::BrCond, whileTrue,
                      whileEnd, condStr, mir::inst::JumpKind::Loop);
  irGenerator.ir_label(whileTrue);

  match_one_word(Token::RPARENT);

  gm_stmt();

  irGenerator.ir_label(whileBegin);

  endWhileIndex = get_matched_index();
  set_matched_index(condIndex);
  cond = gm_cond();
  set_matched_index(endWhileIndex);

  if (cond->_type == NodeType::CNS) {
    string tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
    RightVal right;
    right.emplace<0>(cond->_value);
    irGenerator.ir_assign(tmpName, right);
    condStr = tmpName;
  } else {
    condStr = cond->_name;
  }
  irGenerator.ir_jump(mir::inst::JumpInstructionKind::BrCond, whileTrue,
                      whileEnd, condStr, mir::inst::JumpKind::Loop);
  irGenerator.ir_label(whileEnd);

  irGenerator.popWhile();
}